

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall yactfr::internal::JsonBoValReq::_validate(JsonBoValReq *this,JsonVal *jsonVal)

{
  JsonScalarValInSetReq<yactfr::internal::JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>,_(yactfr::internal::JsonValKind)5>
  ::_validate(&this->super_JsonStrValInSetReq,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonStrValInSetReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid byte order:", jsonVal.loc());
            throw;
        }
    }